

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_enc_v2.cpp
# Opt level: O2

MPP_RET mpp_enc_init_v2(MppEnc *enc,MppEncInitCfg *cfg)

{
  MppCodingType coding;
  undefined8 uVar1;
  MppEncRefs refs;
  MPP_RET MVar2;
  MppCodingType *ctx;
  size_t sVar3;
  void *pvVar4;
  MppPort pvVar5;
  MppEncRefCfg src;
  MppEncRefCfg pvVar6;
  char *pcVar7;
  MppEncHal enc_hal;
  EncImpl impl;
  EncImplCfg ctrl_cfg;
  MppEncHalCfg enc_hal_cfg;
  
  coding = cfg->coding;
  impl = (EncImpl)0x0;
  enc_hal = (MppEncHal)0x0;
  mpp_env_get_u32("mpp_enc_debug",&mpp_enc_debug,0);
  if (enc == (MppEnc *)0x0) {
    _mpp_log_l(2,"mpp_enc","failed to malloc context\n","mpp_enc_init_v2");
    MVar2 = MPP_ERR_NULL_PTR;
  }
  else {
    *enc = (MppEnc)0x0;
    ctx = (MppCodingType *)mpp_osal_calloc("mpp_enc_init_v2",0x1b98);
    if (ctx == (MppCodingType *)0x0) {
      _mpp_log_l(2,"mpp_enc","failed to malloc context\n","mpp_enc_init_v2");
      MVar2 = MPP_ERR_MALLOC;
    }
    else {
      MVar2 = mpp_enc_refs_init((MppEncRefs *)(ctx + 0x84));
      if (MVar2 == MPP_OK) {
        enc_hal_cfg.output_cb = (MppCbCtx *)(ctx + 0x2c);
        *(code **)(ctx + 0x2c) = mpp_enc_callback;
        *(MppCodingType **)(ctx + 0x2e) = ctx;
        ctx[0x30] = 0x200;
        ctrl_cfg.cfg = (MppEncCfgSet *)(ctx + 0xb2);
        enc_hal_cfg.task_cnt = cfg->task_cnt;
        ctrl_cfg.type = VPU_CLIENT_BUTT;
        enc_hal_cfg.dev = (MppDev)0x0;
        enc_hal_cfg.cap_recn_out = 0;
        ctrl_cfg.refs = *(MppEncRefs *)(ctx + 0x84);
        ctrl_cfg.coding = coding;
        enc_hal_cfg.coding = coding;
        enc_hal_cfg.cfg = ctrl_cfg.cfg;
        enc_hal_cfg.type = ctrl_cfg.type;
        MVar2 = mpp_enc_hal_init(&enc_hal,&enc_hal_cfg);
        if (MVar2 == MPP_OK) {
          ctrl_cfg.type = enc_hal_cfg.type;
          MVar2 = enc_impl_init(&impl,&ctrl_cfg);
          if (MVar2 == MPP_OK) {
            MVar2 = hal_info_init((HalInfo *)(ctx + 8),MPP_CTX_ENC,coding);
            if (MVar2 == MPP_OK) {
              *ctx = coding;
              *(EncImpl *)(ctx + 2) = impl;
              *(MppEncHal *)(ctx + 4) = enc_hal;
              *(MppDev *)(ctx + 6) = enc_hal_cfg.dev;
              *(void **)(ctx + 0x1c) = cfg->mpp;
              *(HalTaskGroup *)(ctx + 0x32) = enc_hal_cfg.tasks;
              ctx[0x79] = MPP_VIDEO_CodingAutoDetect;
              pcVar7 = get_mpp_version();
              *(char **)(ctx + 0x7a) = pcVar7;
              sVar3 = strlen(pcVar7);
              ctx[0x7c] = (MppCodingType)sVar3;
              ctx[0x82] = 0x400;
              pvVar4 = mpp_osal_calloc("mpp_enc_init_v2",0x400);
              *(void **)(ctx + 0x7e) = pvVar4;
              if (enc_hal_cfg.cap_recn_out != 0) {
                ctx[0x8e] = MPP_VIDEO_CodingAutoDetect;
              }
              pvVar4 = mpp_osal_calloc("mpp_enc_init_v2",0x1000);
              *(void **)(ctx + 0x74) = pvVar4;
              mpp_packet_init((MppPacket *)(ctx + 0x72),pvVar4,0x1000);
              mpp_packet_set_length(*(MppPacket *)(ctx + 0x72),0);
              uVar1 = *(undefined8 *)(ctx + 0x1c);
              pvVar5 = mpp_task_queue_get_port(*(MppTaskQueue *)(uVar1 + 0x70),MPP_PORT_OUTPUT);
              *(MppPort *)(ctx + 0x1e) = pvVar5;
              pvVar5 = mpp_task_queue_get_port(*(MppTaskQueue *)(uVar1 + 0x78),MPP_PORT_INPUT);
              *(MppPort *)(ctx + 0x20) = pvVar5;
              ctx[0x182] = coding;
              *(MppCodingType **)(ctx + 0x5c2) = ctx + 0x5c4;
              mpp_enc_ref_cfg_init((MppEncRefCfg *)(ctx + 0x45a));
              pvVar6 = *(MppEncRefCfg *)(ctx + 0x45a);
              src = mpp_enc_ref_default();
              mpp_enc_ref_cfg_copy(pvVar6,src);
              refs = *(MppEncRefs *)(ctx + 0x84);
              pvVar6 = mpp_enc_ref_default();
              MVar2 = mpp_enc_refs_set_cfg(refs,pvVar6);
              mpp_enc_refs_set_rc_igop(*(MppEncRefs *)(ctx + 0x84),ctx[0xe3]);
              sem_init((sem_t *)(ctx + 0x4e),0,0);
              sem_init((sem_t *)(ctx + 0x62),0,0);
              sem_init((sem_t *)(ctx + 0x6a),0,0);
              *enc = ctx;
              return MVar2;
            }
            pcVar7 = "could not init hal info\n";
          }
          else {
            pcVar7 = "could not init impl\n";
          }
        }
        else {
          pcVar7 = "could not init enc hal\n";
        }
      }
      else {
        pcVar7 = "could not init enc refs\n";
      }
      _mpp_log_l(2,"mpp_enc",pcVar7,"mpp_enc_init_v2");
      mpp_enc_deinit_v2(ctx);
    }
  }
  return MVar2;
}

Assistant:

MPP_RET mpp_enc_init_v2(MppEnc *enc, MppEncInitCfg *cfg)
{
    MPP_RET ret;
    MppCodingType coding = cfg->coding;
    EncImpl impl = NULL;
    MppEncImpl *p = NULL;
    MppEncHal enc_hal = NULL;
    MppEncHalCfg enc_hal_cfg;
    EncImplCfg ctrl_cfg;

    mpp_env_get_u32("mpp_enc_debug", &mpp_enc_debug, 0);

    if (NULL == enc) {
        mpp_err_f("failed to malloc context\n");
        return MPP_ERR_NULL_PTR;
    }

    *enc = NULL;

    p = mpp_calloc(MppEncImpl, 1);
    if (NULL == p) {
        mpp_err_f("failed to malloc context\n");
        return MPP_ERR_MALLOC;
    }

    ret = mpp_enc_refs_init(&p->refs);
    if (ret) {
        mpp_err_f("could not init enc refs\n");
        goto ERR_RET;
    }

    p->output_cb.callBack = mpp_enc_callback;
    p->output_cb.ctx = p;
    p->output_cb.cmd = ENC_CALLBACK_BASE;

    // H.264 encoder use mpp_enc_hal path
    // create hal first
    enc_hal_cfg.coding = coding;
    enc_hal_cfg.cfg = &p->cfg;
    enc_hal_cfg.output_cb = &p->output_cb;
    enc_hal_cfg.task_cnt = cfg->task_cnt;
    enc_hal_cfg.type = VPU_CLIENT_BUTT;
    enc_hal_cfg.dev = NULL;
    enc_hal_cfg.cap_recn_out = 0;

    ctrl_cfg.coding = coding;
    ctrl_cfg.type = VPU_CLIENT_BUTT;
    ctrl_cfg.cfg = &p->cfg;
    ctrl_cfg.refs = p->refs;

    ret = mpp_enc_hal_init(&enc_hal, &enc_hal_cfg);
    if (ret) {
        mpp_err_f("could not init enc hal\n");
        goto ERR_RET;
    }

    ctrl_cfg.type = enc_hal_cfg.type;

    ret = enc_impl_init(&impl, &ctrl_cfg);
    if (ret) {
        mpp_err_f("could not init impl\n");
        goto ERR_RET;
    }

    ret = hal_info_init(&p->hal_info, MPP_CTX_ENC, coding);
    if (ret) {
        mpp_err_f("could not init hal info\n");
        goto ERR_RET;
    }

    p->coding   = coding;
    p->impl     = impl;
    p->enc_hal  = enc_hal;
    p->dev      = enc_hal_cfg.dev;
    p->mpp      = cfg->mpp;
    p->tasks    = enc_hal_cfg.tasks;
    p->sei_mode = MPP_ENC_SEI_MODE_ONE_SEQ;
    p->version_info = get_mpp_version();
    p->version_length = strlen(p->version_info);
    p->rc_cfg_size = SZ_1K;
    p->rc_cfg_info = mpp_calloc_size(char, p->rc_cfg_size);

    if (enc_hal_cfg.cap_recn_out)
        p->support_hw_deflicker = 1;

    {
        // create header packet storage
        size_t size = SZ_4K;
        p->hdr_buf = mpp_calloc_size(void, size);

        mpp_packet_init(&p->hdr_pkt, p->hdr_buf, size);
        mpp_packet_set_length(p->hdr_pkt, 0);
    }
    {
        Mpp *mpp = (Mpp *)p->mpp;

        p->input  = mpp_task_queue_get_port(mpp->mInputTaskQueue,  MPP_PORT_OUTPUT);
        p->output = mpp_task_queue_get_port(mpp->mOutputTaskQueue, MPP_PORT_INPUT);
    }

    /* NOTE: setup configure coding for check */
    p->cfg.codec.coding = coding;
    p->cfg.plt_cfg.plt = &p->cfg.plt_data;
    mpp_enc_ref_cfg_init(&p->cfg.ref_cfg);
    ret = mpp_enc_ref_cfg_copy(p->cfg.ref_cfg, mpp_enc_ref_default());
    ret = mpp_enc_refs_set_cfg(p->refs, mpp_enc_ref_default());
    mpp_enc_refs_set_rc_igop(p->refs, p->cfg.rc.gop);

    sem_init(&p->enc_reset, 0, 0);
    sem_init(&p->cmd_start, 0, 0);
    sem_init(&p->cmd_done, 0, 0);

    *enc = p;
    return ret;
ERR_RET:
    mpp_enc_deinit_v2(p);
    return ret;
}